

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructBuilder *
capnp::_::WireHelpers::getWritableStructPointer
          (StructBuilder *__return_storage_ptr__,WirePointer *ref,word *refTarget,
          SegmentBuilder *segment,CapTableBuilder *capTable,StructSize size,word *defaultValue,
          BuilderArena *orphanArena)

{
  void **ppvVar1;
  bool bVar2;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> ds;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> rc;
  Kind KVar3;
  word *to;
  unsigned_short *puVar4;
  uint uVar5;
  Iterator local_98;
  Iterator local_96;
  Range<unsigned_short> RStack_94;
  unsigned_short i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_short> *__range3;
  WirePointer *newPointerSection;
  word *ptr;
  uint totalSize;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> newPointerCount;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> newDataSize;
  WirePointer *oldPointerSection;
  unsigned_short oldPointerCount;
  unsigned_short oldDataSize;
  Fault local_58;
  Fault f;
  word *oldPtr;
  SegmentBuilder *oldSegment;
  WirePointer *oldRef;
  CapTableBuilder *local_30;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  word *refTarget_local;
  WirePointer *ref_local;
  StructSize size_local;
  
  local_30 = capTable;
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)refTarget;
  refTarget_local = (word *)ref;
  ref_local._4_4_ = size;
  bVar2 = WirePointer::isNull(ref);
  if (bVar2) goto LAB_007fc446;
  while( true ) {
    oldSegment = (SegmentBuilder *)refTarget_local;
    oldPtr = (word *)capTable_local;
    f.exception = (Exception *)
                  followFars((WirePointer **)&oldSegment,(word *)segment_local,
                             (SegmentBuilder **)&oldPtr);
    KVar3 = WirePointer::kind((WirePointer *)oldSegment);
    if (KVar3 == STRUCT) {
      oldPointerSection._2_2_ =
           DirectWireValue<unsigned_short>::get
                     ((DirectWireValue<unsigned_short> *)
                      ((long)&(oldSegment->super_SegmentReader).arena + 4));
      oldPointerSection._0_2_ =
           DirectWireValue<unsigned_short>::get
                     ((DirectWireValue<unsigned_short> *)
                      ((long)&(oldSegment->super_SegmentReader).arena + 6));
      uVar5 = (uint)oldPointerSection._2_2_;
      ppvVar1 = (f.exception)->trace;
      if ((oldPointerSection._2_2_ < ref_local._4_2_) ||
         ((unsigned_short)oldPointerSection < ref_local._6_2_)) {
        ds = kj::max<unsigned_short&,unsigned_short&>
                       ((unsigned_short *)((long)&oldPointerSection + 2),
                        (unsigned_short *)((long)&ref_local + 4));
        rc = kj::max<unsigned_short&,unsigned_short&>
                       ((unsigned_short *)&oldPointerSection,
                        (unsigned_short *)((long)&ref_local + 6));
        zeroPointerAndFars((SegmentBuilder *)capTable_local,(WirePointer *)refTarget_local);
        to = allocate((WirePointer **)&refTarget_local,(SegmentBuilder **)&capTable_local,local_30,
                      (uint)ds + (uint)rc,STRUCT,orphanArena);
        WirePointer::StructRef::set((StructRef *)((long)&refTarget_local->content + 4),ds,rc);
        copyMemory(to,(word *)f.exception,(uint)oldPointerSection._2_2_);
        RStack_94 = kj::zeroTo<unsigned_short>((unsigned_short)oldPointerSection);
        ___end3 = &stack0xffffffffffffff6c;
        local_96 = kj::Range<unsigned_short>::begin(___end3);
        local_98 = kj::Range<unsigned_short>::end(___end3);
        while (bVar2 = kj::Range<unsigned_short>::Iterator::operator!=(&local_96,&local_98), bVar2)
        {
          puVar4 = kj::Range<unsigned_short>::Iterator::operator*(&local_96);
          transferPointer((SegmentBuilder *)capTable_local,
                          (WirePointer *)(to + (int)(uint)ds) + (int)(uint)*puVar4,
                          (SegmentBuilder *)oldPtr,
                          (WirePointer *)(ppvVar1 + (long)(int)uVar5 + -10) + (int)(uint)*puVar4);
          kj::Range<unsigned_short>::Iterator::operator++(&local_96);
        }
        zeroMemory((word *)f.exception,
                   (uint)oldPointerSection._2_2_ + (uint)(unsigned_short)oldPointerSection);
        StructBuilder::StructBuilder
                  (__return_storage_ptr__,(SegmentBuilder *)capTable_local,local_30,to,
                   (WirePointer *)(to + (int)(uint)ds),(uint)ds << 6,rc);
      }
      else {
        StructBuilder::StructBuilder
                  (__return_storage_ptr__,(SegmentBuilder *)oldPtr,local_30,f.exception,
                   (WirePointer *)(ppvVar1 + (long)(int)uVar5 + -10),
                   (uint)oldPointerSection._2_2_ << 6,(unsigned_short)oldPointerSection);
      }
      return __return_storage_ptr__;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[71]>
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x465,FAILED,"oldRef->kind() == WirePointer::STRUCT",
               "\"Message contains non-struct pointer where struct pointer was expected.\"",
               (char (*) [71])
               "Message contains non-struct pointer where struct pointer was expected.");
    kj::_::Debug::Fault::~Fault(&local_58);
LAB_007fc446:
    if ((defaultValue == (word *)0x0) ||
       (bVar2 = WirePointer::isNull((WirePointer *)defaultValue), bVar2)) break;
    segment_local =
         (SegmentBuilder *)
         copyMessage((SegmentBuilder **)&capTable_local,local_30,(WirePointer **)&refTarget_local,
                     (WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  }
  oldRef._4_4_ = ref_local._4_4_;
  initStructPointer(__return_storage_ptr__,(WirePointer *)refTarget_local,
                    (SegmentBuilder *)capTable_local,local_30,ref_local._4_4_,orphanArena);
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(StructBuilder getWritableStructPointer(
      WirePointer* ref, word* refTarget, SegmentBuilder* segment, CapTableBuilder* capTable,
      StructSize size, const word* defaultValue, BuilderArena* orphanArena = nullptr)) {
    if (ref->isNull()) {
    useDefault:
      if (defaultValue == nullptr ||
          reinterpret_cast<const WirePointer*>(defaultValue)->isNull()) {
        return initStructPointer(ref, segment, capTable, size, orphanArena);
      }
      refTarget = copyMessage(segment, capTable, ref,
          reinterpret_cast<const WirePointer*>(defaultValue));
      defaultValue = nullptr;  // If the default value is itself invalid, don't use it again.
    }

    WirePointer* oldRef = ref;
    SegmentBuilder* oldSegment = segment;
    word* oldPtr = followFars(oldRef, refTarget, oldSegment);

    KJ_REQUIRE(oldRef->kind() == WirePointer::STRUCT,
        "Message contains non-struct pointer where struct pointer was expected.") {
      goto useDefault;
    }

    auto oldDataSize = oldRef->structRef.dataSize.get();
    auto oldPointerCount = oldRef->structRef.ptrCount.get();
    WirePointer* oldPointerSection =
        reinterpret_cast<WirePointer*>(oldPtr + oldDataSize);

    if (oldDataSize < size.data || oldPointerCount < size.pointers) {
      // The space allocated for this struct is too small.  Unlike with readers, we can't just
      // run with it and do bounds checks at access time, because how would we handle writes?
      // Instead, we have to copy the struct to a new space now.

      auto newDataSize = kj::max(oldDataSize, size.data);
      auto newPointerCount = kj::max(oldPointerCount, size.pointers);
      auto totalSize = newDataSize + newPointerCount * WORDS_PER_POINTER;

      // Don't let allocate() zero out the object just yet.
      zeroPointerAndFars(segment, ref);

      word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::STRUCT, orphanArena);
      ref->structRef.set(newDataSize, newPointerCount);

      // Copy data section.
      copyMemory(ptr, oldPtr, oldDataSize);

      // Copy pointer section.
      WirePointer* newPointerSection = reinterpret_cast<WirePointer*>(ptr + newDataSize);
      for (auto i: kj::zeroTo(oldPointerCount)) {
        transferPointer(segment, newPointerSection + i, oldSegment, oldPointerSection + i);
      }

      // Zero out old location.  This has two purposes:
      // 1) We don't want to leak the original contents of the struct when the message is written
      //    out as it may contain secrets that the caller intends to remove from the new copy.
      // 2) Zeros will be deflated by packing, making this dead memory almost-free if it ever
      //    hits the wire.
      zeroMemory(oldPtr, oldDataSize + oldPointerCount * WORDS_PER_POINTER);

      return StructBuilder(segment, capTable, ptr, newPointerSection, newDataSize * BITS_PER_WORD,
                           newPointerCount);
    } else {
      return StructBuilder(oldSegment, capTable, oldPtr, oldPointerSection,
                           oldDataSize * BITS_PER_WORD, oldPointerCount);
    }
  }